

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O0

bool DirImage(string *path)

{
  bool bVar1;
  element_type *disk_00;
  bool local_39;
  undefined1 local_20 [8];
  shared_ptr<Disk> disk;
  string *path_local;
  
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  std::make_shared<Disk>();
  bVar1 = ReadImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_20,true);
  local_39 = false;
  if (bVar1) {
    disk_00 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                        ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_20);
    local_39 = Dir(disk_00);
  }
  std::shared_ptr<Disk>::~shared_ptr((shared_ptr<Disk> *)local_20);
  return local_39;
}

Assistant:

bool DirImage(const std::string& path)
{
    auto disk = std::make_shared<Disk>();
    return ReadImage(path, disk) && Dir(*disk);
}